

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.h
# Opt level: O0

void __thiscall
InlineeFrameInfo::IterateSyms<BackwardPass::ProcessInlineeEnd(IR::Instr*)::__1>
          (InlineeFrameInfo *this,anon_class_8_1_8991fb9c_for_callback callback,bool inReverse)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_class_8_1_dda845c3 iterator;
  bool inReverse_local;
  InlineeFrameInfo *this_local;
  anon_class_8_1_8991fb9c_for_callback callback_local;
  
  this_local = (InlineeFrameInfo *)callback.this;
  if ((inReverse) && ((this->function).type == InlineeFrameInfoValueType_Sym)) {
    IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp:8314:51)>
    ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
              ((anon_class_8_1_8991fb9c_for_callback *)&this_local,(this->function).field_1.sym);
  }
  if (inReverse) {
    JsUtil::
    List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
    ::
    ReverseMap<InlineeFrameInfo::IterateSyms<BackwardPass::ProcessInlineeEnd(IR::Instr*)::__1>(BackwardPass::ProcessInlineeEnd(IR::Instr*)::__1,bool)::_lambda(unsigned_int,InlineFrameInfoValue&)_1_>
              ((List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)this->arguments,(anon_class_8_1_dda845c3)callback.this);
  }
  else {
    JsUtil::
    List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
    ::
    Map<InlineeFrameInfo::IterateSyms<BackwardPass::ProcessInlineeEnd(IR::Instr*)::__1>(BackwardPass::ProcessInlineeEnd(IR::Instr*)::__1,bool)::_lambda(unsigned_int,InlineFrameInfoValue&)_1_>
              ((List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)this->arguments,(anon_class_8_1_dda845c3)callback.this);
  }
  if ((this->function).type == InlineeFrameInfoValueType_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                       ,0xbf,"(function.type != InlineeFrameInfoValueType_None)",
                       "function.type != InlineeFrameInfoValueType_None");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((!inReverse) && ((this->function).type == InlineeFrameInfoValueType_Sym)) {
    IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp:8314:51)>
    ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
              ((anon_class_8_1_8991fb9c_for_callback *)&this_local,(this->function).field_1.sym);
  }
  return;
}

Assistant:

void IterateSyms(Fn callback, bool inReverse = false)
    {
        auto iterator = [=](uint index, InlineFrameInfoValue& value)
        {
            if (value.type == InlineeFrameInfoValueType_Sym)
            {
                callback(value.sym);
            }
            Assert(value.type != InlineeFrameInfoValueType_None);
        };

        if (inReverse && function.type == InlineeFrameInfoValueType_Sym)
        {
            callback(function.sym);
        }

        if (inReverse)
        {
            arguments->ReverseMap(iterator);
        }
        else
        {
            arguments->Map(iterator);
        }
        Assert(function.type != InlineeFrameInfoValueType_None);
        if (!inReverse && function.type == InlineeFrameInfoValueType_Sym)
        {
            callback(function.sym);
        }
    }